

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_string.c
# Opt level: O2

int cmime_string_is_7bit(char *s)

{
  char cVar1;
  
  if (s == (char *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_string.c"
                  ,100,"int cmime_string_is_7bit(const char *)");
  }
  do {
    cVar1 = *s;
    if (cVar1 == '\0') {
      return 0;
    }
    s = s + 1;
  } while (-1 < cVar1);
  return -1;
}

Assistant:

int cmime_string_is_7bit(const char *s) {
    const char *it = NULL;
    assert(s);

    it = s;
    while(*it != '\0') {
        if (((unsigned char)(*it) > (unsigned char) 127)||(*it < 0))
            return(-1);
        it++;
    }

    return(0);
}